

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timespec_get.c
# Opt level: O2

int timespec_get(timespec *ts,int base)

{
  int iVar1;
  int iVar2;
  timeval tv;
  
  iVar2 = 0;
  if (base == 1) {
    iVar2 = 0;
    iVar1 = gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      ts->tv_sec = tv.tv_sec;
      ts->tv_nsec = tv.tv_usec * 1000;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int timespec_get( struct timespec * ts, int base )
{
    if ( base == TIME_UTC )
    {
        /* We can make do with a really thin wrapper here. */
        struct timeval tv;

        if ( gettimeofday( &tv, NULL ) == 0 )
        {
            ts->tv_sec = tv.tv_sec;
            ts->tv_nsec = tv.tv_usec * 1000;
            return base;
        }
    }

    /* Not supporting any other time base than TIME_UTC for now. */
    return 0;
}